

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Aig_Obj_t *
createArenaViolation
          (Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pWindowBegins,Aig_Obj_t *pWithinWindow,
          Vec_Ptr_t *vMasterBarriers,Vec_Ptr_t *vBarrierLo,Vec_Ptr_t *vBarrierLiDriver,
          Vec_Ptr_t *vMonotoneDisjunctionNodes)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  Aig_Obj_t *p1;
  Vec_Ptr_t *__ptr;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  int iVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  int iVar11;
  
  if (vBarrierLiDriver == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierLiDriver != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb6,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes == (Vec_Ptr_t *)0x0) {
    __assert_fail("vMonotoneDisjunctionNodes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb7,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  pAVar9 = pAigNew->pConst1;
  __ptr = collectBarrierDisjunctions(pAigOld,pAigNew,vMasterBarriers);
  if (__ptr == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierSignals != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbc,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes->nSize != 0) {
    __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbe,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  iVar8 = __ptr->nSize;
  lVar7 = (long)iVar8;
  if (0 < lVar7) {
    ppvVar2 = __ptr->pArray;
    lVar10 = 0;
    do {
      pvVar3 = ppvVar2[lVar10];
      uVar1 = vMonotoneDisjunctionNodes->nCap;
      if (vMonotoneDisjunctionNodes->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vMonotoneDisjunctionNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vMonotoneDisjunctionNodes->pArray,0x80);
          }
          vMonotoneDisjunctionNodes->pArray = ppvVar4;
          iVar11 = 0x10;
        }
        else {
          iVar11 = uVar1 * 2;
          if (iVar11 <= (int)uVar1) goto LAB_0058fd6d;
          if (vMonotoneDisjunctionNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vMonotoneDisjunctionNodes->pArray,(ulong)uVar1 << 4);
          }
          vMonotoneDisjunctionNodes->pArray = ppvVar4;
        }
        vMonotoneDisjunctionNodes->nCap = iVar11;
      }
LAB_0058fd6d:
      iVar11 = vMonotoneDisjunctionNodes->nSize;
      vMonotoneDisjunctionNodes->nSize = iVar11 + 1;
      vMonotoneDisjunctionNodes->pArray[iVar11] = pvVar3;
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  if (vMonotoneDisjunctionNodes->nSize != vMasterBarriers->nSize) {
    __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xc1,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
  if (0 < iVar8) {
    ppvVar2 = __ptr->pArray;
    lVar10 = 0;
    do {
      pAVar6 = (Aig_Obj_t *)ppvVar2[lVar10];
      pAVar5 = Aig_And(pAigNew,pAVar6,pWindowBegins);
      if (vBarrierLo->nSize <= lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p1 = (Aig_Obj_t *)vBarrierLo->pArray[lVar10];
      pAVar5 = Aig_Or(pAigNew,pAVar5,p1);
      uVar1 = vBarrierLiDriver->nCap;
      if (vBarrierLiDriver->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vBarrierLiDriver->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vBarrierLiDriver->pArray,0x80);
          }
          vBarrierLiDriver->pArray = ppvVar4;
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar1 * 2;
          if (iVar8 <= (int)uVar1) goto LAB_0058fe7e;
          if (vBarrierLiDriver->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vBarrierLiDriver->pArray,(ulong)uVar1 << 4);
          }
          vBarrierLiDriver->pArray = ppvVar4;
        }
        vBarrierLiDriver->nCap = iVar8;
      }
LAB_0058fe7e:
      iVar8 = vBarrierLiDriver->nSize;
      vBarrierLiDriver->nSize = iVar8 + 1;
      vBarrierLiDriver->pArray[iVar8] = pAVar5;
      pAVar6 = Aig_Xor(pAigNew,pAVar6,p1);
      pAVar6 = Aig_And(pAigNew,pAVar6,pWithinWindow);
      pAVar9 = Aig_Or(pAigNew,pAVar6,pAVar9);
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  free(__ptr);
  return pAVar9;
}

Assistant:

Aig_Obj_t *createArenaViolation(
		Aig_Man_t *pAigOld,
		Aig_Man_t *pAigNew, 
		Aig_Obj_t *pWindowBegins, 
		Aig_Obj_t *pWithinWindow, 
		Vec_Ptr_t *vMasterBarriers, 
		Vec_Ptr_t *vBarrierLo,
		Vec_Ptr_t *vBarrierLiDriver,
		Vec_Ptr_t *vMonotoneDisjunctionNodes
		)
{
	Aig_Obj_t *pWindowBeginsLocal = pWindowBegins;
	Aig_Obj_t *pWithinWindowLocal = pWithinWindow;
	int i;
	Aig_Obj_t *pObj, *pObjAnd1, *pObjOr1, *pObjAnd2, *pObjBarrierLo, *pObjBarrierSwitch, *pObjArenaViolation;
	Vec_Ptr_t *vBarrierSignals;

	assert( vBarrierLiDriver != NULL );
	assert( vMonotoneDisjunctionNodes != NULL );

	pObjArenaViolation = Aig_Not(Aig_ManConst1( pAigNew ));

	vBarrierSignals = collectBarrierDisjunctions(pAigOld, pAigNew, vMasterBarriers);
	assert( vBarrierSignals != NULL );

	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0 );
	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
		Vec_PtrPush( vMonotoneDisjunctionNodes, pObj );
	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers ) );

	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
	{
		//pObjNew = driverToPoNew( pAigOld, pObj );
		pObjAnd1 = Aig_And(pAigNew, pObj, pWindowBeginsLocal);
		pObjBarrierLo = (Aig_Obj_t *)Vec_PtrEntry( vBarrierLo, i );
		pObjOr1 = Aig_Or(pAigNew, pObjAnd1, pObjBarrierLo);
		Vec_PtrPush( vBarrierLiDriver, pObjOr1 );

		pObjBarrierSwitch = Aig_Xor( pAigNew, pObj, pObjBarrierLo );
		pObjAnd2 = Aig_And( pAigNew, pObjBarrierSwitch, pWithinWindowLocal );
		pObjArenaViolation = Aig_Or( pAigNew, pObjAnd2, pObjArenaViolation );
	}

	Vec_PtrFree(vBarrierSignals);
	return pObjArenaViolation;
}